

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseStorage.h
# Opt level: O0

void __thiscall
Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
          (DenseStorage<double,__1,__1,_1,_0> *this,DenseIndex size,DenseIndex nbRows,
          DenseIndex param_4)

{
  double *pdVar1;
  double *in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  
  if (in_RSI != in_RDI[1]) {
    internal::conditional_aligned_delete_auto<double,true>(in_RCX,(size_t)in_RDI);
    if (in_RSI == 0) {
      *in_RDI = 0;
    }
    else {
      pdVar1 = internal::conditional_aligned_new_auto<double,true>((size_t)in_RCX);
      *in_RDI = pdVar1;
    }
  }
  in_RDI[1] = in_RDX;
  return;
}

Assistant:

EIGEN_STRONG_INLINE void resize(DenseIndex size, DenseIndex nbRows, DenseIndex)
    {
      if(size != m_rows*_Cols)
      {
        internal::conditional_aligned_delete_auto<T,(_Options&DontAlign)==0>(m_data, _Cols*m_rows);
        if (size)
          m_data = internal::conditional_aligned_new_auto<T,(_Options&DontAlign)==0>(size);
        else
          m_data = 0;
        EIGEN_INTERNAL_DENSE_STORAGE_CTOR_PLUGIN
      }
      m_rows = nbRows;
    }